

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int ucstricmp(qsizetype alen,char16_t *a,qsizetype blen,char16_t *b)

{
  char16_t cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  long lVar8;
  uint uVar9;
  short sVar10;
  
  if (a == b) {
    iVar3 = ((blen < alen) - 1) + (uint)(blen < alen);
    if (alen == blen) {
      iVar3 = 0;
    }
    return iVar3;
  }
  qVar7 = blen;
  if (alen < blen) {
    qVar7 = alen;
  }
  if (qVar7 < 1) {
    qVar7 = 0;
  }
  else {
    lVar8 = 0;
    uVar5 = 0;
    uVar9 = 0;
    do {
      uVar6 = (uint)(ushort)a[lVar8];
      iVar3 = uVar5 * 0x400 + -0x35fdc00;
      if ((uVar5 & 0xfc00) != 0xd800 || (uVar6 & 0xfc00) != 0xdc00) {
        iVar3 = 0;
      }
      uVar4 = iVar3 + uVar6;
      uVar5 = 0xff;
      if (uVar4 < 0x11000) {
        uVar5 = 0x1f;
      }
      uVar2 = uVar4 >> 5;
      if (0x10fff < uVar4) {
        uVar2 = (uVar4 - 0x11000 >> 8) + 0x880;
      }
      sVar10 = (short)((uint)(int)(short)*(ushort *)
                                          (QUnicodeTables::uc_properties +
                                          (ulong)*(ushort *)
                                                  (QUnicodeTables::uc_property_trie +
                                                  (ulong)((uVar5 & uVar4) +
                                                         (uint)*(ushort *)
                                                                (QUnicodeTables::uc_property_trie +
                                                                (ulong)uVar2 * 2)) * 2) * 0x14 + 0xe
                                          ) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar5 & uVar4) +
                           (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar2 * 2)) *
                    2) * 0x14 + 0xe) & 1) == 0) {
        uVar4 = uVar4 + (int)sVar10;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar10 * 2) == 1) {
        uVar4 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar10 * 2 + 2);
      }
      cVar1 = b[lVar8];
      iVar3 = uVar9 * 0x400 + -0x35fdc00;
      if ((uVar9 & 0xfc00) != 0xd800 || ((ushort)cVar1 & 0xfc00) != 0xdc00) {
        iVar3 = 0;
      }
      uVar9 = iVar3 + (uint)(ushort)cVar1;
      uVar5 = 0xff;
      if (uVar9 < 0x11000) {
        uVar5 = 0x1f;
      }
      uVar2 = uVar9 >> 5;
      if (0x10fff < uVar9) {
        uVar2 = (uVar9 - 0x11000 >> 8) + 0x880;
      }
      sVar10 = (short)((uint)(int)(short)*(ushort *)
                                          (QUnicodeTables::uc_properties +
                                          (ulong)*(ushort *)
                                                  (QUnicodeTables::uc_property_trie +
                                                  (ulong)((uVar5 & uVar9) +
                                                         (uint)*(ushort *)
                                                                (QUnicodeTables::uc_property_trie +
                                                                (ulong)uVar2 * 2)) * 2) * 0x14 + 0xe
                                          ) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((uVar5 & uVar9) +
                           (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (ulong)uVar2 * 2)) *
                    2) * 0x14 + 0xe) & 1) == 0) {
        uVar9 = uVar9 + (int)sVar10;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar10 * 2) == 1) {
        uVar9 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar10 * 2 + 2);
      }
      if (uVar4 - uVar9 != 0) {
        return uVar4 - uVar9;
      }
      lVar8 = lVar8 + 1;
      uVar5 = uVar6;
      uVar9 = (uint)(ushort)cVar1;
    } while (qVar7 != lVar8);
  }
  iVar3 = 1;
  if (qVar7 == alen) {
    iVar3 = -(uint)(alen != blen);
  }
  return iVar3;
}

Assistant:

Q_NEVER_INLINE static int ucstricmp(qsizetype alen, const char16_t *a, qsizetype blen, const char16_t *b)
{
    if (a == b)
        return qt_lencmp(alen, blen);

    char32_t alast = 0;
    char32_t blast = 0;
    qsizetype l = qMin(alen, blen);
    qsizetype i;
    for (i = 0; i < l; ++i) {
//         qDebug() << Qt::hex << alast << blast;
//         qDebug() << Qt::hex << "*a=" << *a << "alast=" << alast << "folded=" << foldCase (*a, alast);
//         qDebug() << Qt::hex << "*b=" << *b << "blast=" << blast << "folded=" << foldCase (*b, blast);
        int diff = foldCase(a[i], alast) - foldCase(b[i], blast);
        if ((diff))
            return diff;
    }
    if (i == alen) {
        if (i == blen)
            return 0;
        return -1;
    }
    return 1;
}